

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall CGL::RaytracedRenderer::~RaytracedRenderer(RaytracedRenderer *this)

{
  BVHAccel *this_00;
  PathTracer *this_01;
  
  (this->super_OfflineRenderer)._vptr_OfflineRenderer =
       (_func_int **)&PTR__RaytracedRenderer_0029f6b0;
  this_00 = this->bvh;
  if (this_00 != (BVHAccel *)0x0) {
    CGL::SceneObjects::BVHAccel::~BVHAccel(this_00);
  }
  operator_delete(this_00);
  this_01 = this->pt;
  if (this_01 != (PathTracer *)0x0) {
    CGL::PathTracer::~PathTracer(this_01);
  }
  operator_delete(this_01);
  std::__cxx11::string::~string((string *)&this->filename);
  std::_Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::~_Vector_base
            (&(this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>);
  std::_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
  ~_Deque_base((_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                *)&this->selectionHistory);
  std::condition_variable::~condition_variable(&this->cv_done);
  std::_Vector_base<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::~_Vector_base
            ((_Vector_base<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *)&this->workQueue);
  std::_Vector_base<std::thread_*,_std::allocator<std::thread_*>_>::~_Vector_base
            (&(this->workerThreads).
              super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sampleCountBuffer).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->frameBuffer).data.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&this->ghost_aperture_filename);
  std::__cxx11::string::~string((string *)&this->aperture_filename);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->tile_samples).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

RaytracedRenderer::~RaytracedRenderer() {

  delete bvh;
  delete pt;

}